

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

int xmlHashRemoveEntry3(xmlHashTablePtr table,xmlChar *name,xmlChar *name2,xmlChar *name3,
                       xmlHashDeallocator f)

{
  _xmlHashEntry *__src;
  int iVar1;
  unsigned_long uVar2;
  xmlHashEntryPtr local_50;
  xmlHashEntryPtr prev;
  xmlHashEntryPtr entry;
  unsigned_long key;
  xmlHashDeallocator f_local;
  xmlChar *name3_local;
  xmlChar *name2_local;
  xmlChar *name_local;
  xmlHashTablePtr table_local;
  
  local_50 = (xmlHashEntryPtr)0x0;
  if (((table != (xmlHashTablePtr)0x0) && (name != (xmlChar *)0x0)) &&
     (uVar2 = xmlHashComputeKey(table,name,name2,name3), table->table[uVar2].valid != 0)) {
    for (prev = table->table + uVar2; prev != (xmlHashEntryPtr)0x0; prev = prev->next) {
      iVar1 = xmlStrEqual(prev->name,name);
      if (((iVar1 != 0) && (iVar1 = xmlStrEqual(prev->name2,name2), iVar1 != 0)) &&
         (iVar1 = xmlStrEqual(prev->name3,name3), iVar1 != 0)) {
        if ((f != (xmlHashDeallocator)0x0) && (prev->payload != (void *)0x0)) {
          (*f)(prev->payload,prev->name);
        }
        prev->payload = (void *)0x0;
        if (table->dict == (xmlDictPtr)0x0) {
          if (prev->name != (xmlChar *)0x0) {
            (*xmlFree)(prev->name);
          }
          if (prev->name2 != (xmlChar *)0x0) {
            (*xmlFree)(prev->name2);
          }
          if (prev->name3 != (xmlChar *)0x0) {
            (*xmlFree)(prev->name3);
          }
        }
        if (local_50 == (xmlHashEntryPtr)0x0) {
          if (prev->next == (_xmlHashEntry *)0x0) {
            prev->valid = 0;
          }
          else {
            __src = prev->next;
            memcpy(table->table + uVar2,__src,0x30);
            (*xmlFree)(__src);
          }
        }
        else {
          local_50->next = prev->next;
          (*xmlFree)(prev);
        }
        table->nbElems = table->nbElems + -1;
        return 0;
      }
      local_50 = prev;
    }
  }
  return -1;
}

Assistant:

int
xmlHashRemoveEntry3(xmlHashTablePtr table, const xmlChar *name,
    const xmlChar *name2, const xmlChar *name3, xmlHashDeallocator f) {
    unsigned long key;
    xmlHashEntryPtr entry;
    xmlHashEntryPtr prev = NULL;

    if (table == NULL || name == NULL)
        return(-1);

    key = xmlHashComputeKey(table, name, name2, name3);
    if (table->table[key].valid == 0) {
        return(-1);
    } else {
        for (entry = &(table->table[key]); entry != NULL; entry = entry->next) {
            if (xmlStrEqual(entry->name, name) &&
                    xmlStrEqual(entry->name2, name2) &&
                    xmlStrEqual(entry->name3, name3)) {
                if ((f != NULL) && (entry->payload != NULL))
                    f(entry->payload, entry->name);
                entry->payload = NULL;
		if (table->dict == NULL) {
		    if(entry->name)
			xmlFree(entry->name);
		    if(entry->name2)
			xmlFree(entry->name2);
		    if(entry->name3)
			xmlFree(entry->name3);
		}
                if(prev) {
                    prev->next = entry->next;
		    xmlFree(entry);
		} else {
		    if (entry->next == NULL) {
			entry->valid = 0;
		    } else {
			entry = entry->next;
			memcpy(&(table->table[key]), entry, sizeof(xmlHashEntry));
			xmlFree(entry);
		    }
		}
                table->nbElems--;
                return(0);
            }
            prev = entry;
        }
        return(-1);
    }
}